

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O2

void __thiscall sdf_tools::Grid::Grid(Grid *this,int3 dimensions,real3 offsets,real3 extents)

{
  uint in_EAX;
  undefined8 uStack_18;
  
  (this->field).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->field).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->field).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->dimensions).x = (int)dimensions._0_8_;
  (this->dimensions).y = (int)((ulong)dimensions._0_8_ >> 0x20);
  (this->dimensions).z = dimensions.z;
  (this->offsets).x = (real)(int)offsets._0_8_;
  (this->offsets).y = (real)(int)((ulong)offsets._0_8_ >> 0x20);
  (this->offsets).z = offsets.z;
  (this->extents).x = (real)(int)extents._0_8_;
  (this->extents).y = (real)(int)((ulong)extents._0_8_ >> 0x20);
  (this->extents).z = extents.z;
  uStack_18 = (ulong)in_EAX;
  std::vector<float,_std::allocator<float>_>::resize
            (&this->field,(long)(dimensions.z * dimensions.x * dimensions.y),
             (value_type_conflict1 *)((long)&uStack_18 + 4));
  return;
}

Assistant:

Grid::Grid(int3 dimensions, real3 offsets, real3 extents) :
    dimensions(dimensions),
    offsets(offsets),
    extents(extents)
{
    field.resize(dimensions.x * dimensions.y * dimensions.z, 0);
}